

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubsub.hpp
# Opt level: O2

void __thiscall
ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>::
subscribe(Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
          *this,Subscriber<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                *s)

{
  mapped_type *ppSVar1;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *this_00;
  size_t id;
  size_t local_20;
  
  std::mutex::lock(&this->m);
  local_20 = s->id;
  ppSVar1 = std::
            map<unsigned_long,_ps::Subscriber<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ps::Subscriber<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_*>_>_>
            ::operator[](&this->subs,&local_20);
  *ppSVar1 = s;
  this_00 = &std::
             map<unsigned_long,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
             ::operator[](&this->signals,&local_20)->_M_t;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear(this_00)
  ;
  pthread_mutex_unlock((pthread_mutex_t *)&this->m);
  return;
}

Assistant:

void subscribe(Subscriber<T>* s)
		{
			std::lock_guard<std::mutex> l{m};
			const auto id = s->get_id();
			subs[id] = s;
			signals[id].clear();
		}